

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

int mime_part_rewind(curl_mimepart *part)

{
  mimestate mVar1;
  int iVar2;
  mimestate mVar3;
  
  mVar1 = (part->state).state;
  mVar3 = part->flags * 2 & MIMESTATE_BODY;
  (part->encstate).pos = 0;
  (part->encstate).bufbeg = 0;
  (part->encstate).bufend = 0;
  if (mVar3 < mVar1) {
    if (part->seekfunc == (curl_seek_callback)0x0) {
      return 2;
    }
    iVar2 = (*part->seekfunc)(part->arg,0,0);
    if (iVar2 - 1U < 2) {
      return iVar2;
    }
    if (iVar2 == -1) {
      return 2;
    }
    if (iVar2 != 0) {
      return 1;
    }
  }
  (part->state).state = mVar3;
  (part->state).ptr = (void *)0x0;
  (part->state).offset = 0;
  return 0;
}

Assistant:

static int mime_part_rewind(curl_mimepart *part)
{
  int res = CURL_SEEKFUNC_OK;
  enum mimestate targetstate = MIMESTATE_BEGIN;

  if(part->flags & MIME_BODY_ONLY)
    targetstate = MIMESTATE_BODY;
  cleanup_encoder_state(&part->encstate);
  if(part->state.state > targetstate) {
    res = CURL_SEEKFUNC_CANTSEEK;
    if(part->seekfunc) {
      res = part->seekfunc(part->arg, (curl_off_t) 0, SEEK_SET);
      switch(res) {
      case CURL_SEEKFUNC_OK:
      case CURL_SEEKFUNC_FAIL:
      case CURL_SEEKFUNC_CANTSEEK:
        break;
      case -1:    /* For fseek() error. */
        res = CURL_SEEKFUNC_CANTSEEK;
        break;
      default:
        res = CURL_SEEKFUNC_FAIL;
        break;
      }
    }
  }

  if(res == CURL_SEEKFUNC_OK)
    mimesetstate(&part->state, targetstate, NULL);

  return res;
}